

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferBase.hpp
# Opt level: O3

void __thiscall
Diligent::FramebufferBase<Diligent::EngineVkImplTraits>::FramebufferBase
          (FramebufferBase<Diligent::EngineVkImplTraits> *this,IReferenceCounters *pRefCounters,
          RenderDeviceImplType *pDevice,FramebufferDesc *Desc,bool bIsDeviceInternal)

{
  ITextureView ***pppIVar1;
  ITextureView *pIVar2;
  long lVar3;
  uint *puVar4;
  int iVar5;
  Uint32 UVar6;
  uint uVar7;
  RenderDeviceVkImpl *pDevice_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TextureDesc *TexDesc;
  IMemoryAllocator *pIVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar10;
  undefined4 extraout_var_05;
  uint uVar11;
  char (*Args_1) [47];
  size_type *psVar12;
  char (*Args_1_00) [37];
  ulong uVar13;
  long lVar14;
  long lVar15;
  string ViewName;
  string msg_2;
  MipLevelProperties MipLevelProps;
  allocator local_a9;
  string local_a8;
  string local_88;
  undefined1 local_68 [32];
  Uint64 local_48;
  ITextureView ***local_38;
  long lVar8;
  
  DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                     ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
  ).super_ObjectBase<Diligent::IFramebufferVk>.super_RefCountedObject<Diligent::IFramebufferVk>.
  super_IFramebufferVk.super_IFramebuffer.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_0091dc70;
  this->m_ppAttachments = (ITextureView **)0x0;
  this->m_ppReadOnlyDSVs = (ITextureView **)0x0;
  pDevice_00 = DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
               ::GetDevice(&this->
                            super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                          );
  ValidateFramebufferDesc
            (&(this->
              super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
              ).m_Desc,(IRenderDevice *)pDevice_00);
  UVar6 = (this->
          super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
          ).m_Desc.Width;
  if (((UVar6 == 0) ||
      ((this->
       super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
       ).m_Desc.Height == 0)) ||
     ((this->
      super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
      ).m_Desc.NumArraySlices == 0)) {
    if ((this->
        super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
        ).m_Desc.AttachmentCount != 0) {
      uVar13 = 0;
      do {
        pIVar2 = Desc->ppAttachments[uVar13];
        if (pIVar2 != (ITextureView *)0x0) {
          iVar5 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])();
          lVar8 = CONCAT44(extraout_var,iVar5);
          if (*(char *)(lVar8 + 8) != '\x06') {
            iVar5 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[10])(pIVar2);
            TexDesc = (TextureDesc *)
                      (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x20))
                                ((long *)CONCAT44(extraout_var_00,iVar5));
            GetMipLevelProperties((MipLevelProperties *)local_68,TexDesc,*(Uint32 *)(lVar8 + 0xc));
            if ((this->
                super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                ).m_Desc.Width == 0) {
              (this->
              super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
              ).m_Desc.Width = local_68._0_4_;
            }
            if ((this->
                super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                ).m_Desc.Height == 0) {
              (this->
              super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
              ).m_Desc.Height = local_68._4_4_;
            }
            if ((this->
                super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                ).m_Desc.NumArraySlices == 0) {
              (this->
              super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
              ).m_Desc.NumArraySlices = *(Uint32 *)(lVar8 + 0x18);
            }
          }
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < (this->
                        super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                        ).m_Desc.AttachmentCount);
      UVar6 = (this->
              super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
              ).m_Desc.Width;
    }
    if (UVar6 == 0) {
      LogError<true,char[105]>
                (false,"FramebufferBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                 ,0x68,(char (*) [105])
                       "The framebuffer width is zero and can\'t be automatically determined as there are no non-null attachments"
                );
    }
  }
  if ((this->
      super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
      ).m_Desc.Height == 0) {
    LogError<true,char[106]>
              (false,"FramebufferBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
               ,0x6a,(char (*) [106])
                     "The framebuffer height is zero and can\'t be automatically determined as there are no non-null attachments"
              );
  }
  if ((this->
      super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
      ).m_Desc.NumArraySlices == 0) {
    LogError<true,char[117]>
              (false,"FramebufferBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
               ,0x6c,(char (*) [117])
                     "The framebuffer array slice count is zero and can\'t be automatically determined as there are no non-null attachments"
              );
  }
  pppIVar1 = &this->m_ppAttachments;
  if ((this->
      super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
      ).m_Desc.AttachmentCount != 0) {
    pIVar9 = GetRawAllocator();
    iVar5 = (**pIVar9->_vptr_IMemoryAllocator)
                      (pIVar9,(ulong)(this->
                                     super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                                     ).m_Desc.AttachmentCount << 3,
                       "Memory for framebuffer attachment array",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                       ,0x71);
    this->m_ppAttachments = (ITextureView **)CONCAT44(extraout_var_01,iVar5);
    (this->
    super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
    ).m_Desc.ppAttachments = (ITextureView **)CONCAT44(extraout_var_01,iVar5);
    uVar7 = (this->
            super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
            ).m_Desc.AttachmentCount;
    if (uVar7 != 0) {
      uVar13 = 0;
      do {
        if (Desc->ppAttachments[uVar13] != (ITextureView *)0x0) {
          (*pppIVar1)[uVar13] = Desc->ppAttachments[uVar13];
          (*((*pppIVar1)[uVar13]->super_IDeviceObject).super_IObject._vptr_IObject[1])();
          uVar7 = (this->
                  super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
                  ).m_Desc.AttachmentCount;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < uVar7);
    }
  }
  (*(Desc->pRenderPass->super_IDeviceObject).super_IObject._vptr_IObject[1])();
  local_38 = pppIVar1;
  iVar5 = (*(((this->
              super_DeviceObjectBase<Diligent::IFramebufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::FramebufferDesc>
              ).m_Desc.pRenderPass)->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  lVar8 = CONCAT44(extraout_var_02,iVar5);
  uVar7 = *(uint *)(lVar8 + 0x18);
  if (uVar7 != 0) {
    lVar15 = 5;
    lVar14 = 0;
    uVar13 = 0;
    do {
      lVar3 = *(long *)(lVar8 + 0x20);
      puVar4 = *(uint **)(lVar3 + lVar15 * 8);
      if (((puVar4 != (uint *)0x0) && (uVar11 = *puVar4, uVar11 != 0xffffffff)) &&
         (puVar4[1] == 0x80)) {
        if (this->m_ppReadOnlyDSVs == (ITextureView **)0x0) {
          pIVar9 = GetRawAllocator();
          iVar5 = (**pIVar9->_vptr_IMemoryAllocator)
                            (pIVar9,(ulong)*(uint *)(lVar8 + 0x18) << 3,
                             "Memory for read-only depth attachment array",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                             ,0x8e);
          this->m_ppReadOnlyDSVs = (ITextureView **)CONCAT44(extraout_var_03,iVar5);
          memset((ITextureView **)CONCAT44(extraout_var_03,iVar5),0,
                 (ulong)*(uint *)(lVar8 + 0x18) << 3);
          uVar11 = **(uint **)(lVar3 + lVar15 * 8);
        }
        Args_1 = (char (*) [47])(ulong)uVar11;
        pIVar2 = (*local_38)[(long)Args_1];
        if (pIVar2 == (ITextureView *)0x0) {
          FormatString<char[26],char[28]>
                    ((string *)local_68,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"pDepthAttachment != nullptr",(char (*) [28])Args_1);
          Args_1 = (char (*) [47])0x93;
          DebugAssertionFailed
                    ((Char *)local_68._0_8_,"FramebufferBase",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                     ,0x93);
          if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
            operator_delete((void *)local_68._0_8_,CONCAT44(local_68._20_4_,local_68._16_4_) + 1);
          }
        }
        iVar5 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[4])(pIVar2);
        plVar10 = (long *)CONCAT44(extraout_var_04,iVar5);
        local_68._0_8_ = *plVar10;
        local_68._8_4_ = *(undefined4 *)(plVar10 + 1);
        local_68._12_4_ = *(Uint32 *)((long)plVar10 + 0xc);
        local_68._16_4_ = *(undefined4 *)(plVar10 + 2);
        local_68._20_4_ = *(undefined4 *)((long)plVar10 + 0x14);
        local_68._24_4_ = (undefined4)plVar10[3];
        local_68._28_4_ = *(undefined4 *)((long)plVar10 + 0x1c);
        local_48 = plVar10[4];
        if ((local_68._8_4_ & 0xff) == 3) {
LAB_001fd6ca:
          local_68[8] = 4;
          std::__cxx11::string::string((string *)&local_88,(char *)local_68._0_8_,&local_a9);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_88);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          psVar12 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_a8.field_2._M_allocated_capacity = *psVar12;
            local_a8.field_2._8_8_ = plVar10[3];
          }
          else {
            local_a8.field_2._M_allocated_capacity = *psVar12;
            local_a8._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_a8._M_string_length = plVar10[1];
          *plVar10 = (long)psVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          local_68._0_8_ = local_a8._M_dataplus._M_p;
          iVar5 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[10])(pIVar2);
          Args_1_00 = *(char (**) [37])CONCAT44(extraout_var_05,iVar5);
          (**(code **)(Args_1_00[1] + 0x1b))
                    ((long *)CONCAT44(extraout_var_05,iVar5),local_68,
                     (long)this->m_ppReadOnlyDSVs + lVar14);
          if (*(long *)((long)this->m_ppReadOnlyDSVs + lVar14) == 0) {
            FormatString<char[26],char[37]>
                      (&local_88,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"m_ppReadOnlyDSVs[subpass] != nullptr",Args_1_00);
            DebugAssertionFailed
                      (local_88._M_dataplus._M_p,"FramebufferBase",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                       ,0xa3);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          if ((local_68._8_4_ & 0xff) != 4) {
            FormatString<char[26],char[47]>
                      (&local_a8,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"DSVDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL",Args_1);
            DebugAssertionFailed
                      (local_a8._M_dataplus._M_p,"FramebufferBase",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FramebufferBase.hpp"
                       ,0x9e);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
            goto LAB_001fd6ca;
          }
          *(ITextureView **)((long)this->m_ppReadOnlyDSVs + lVar14) = pIVar2;
          (**(code **)(**(long **)((long)this->m_ppReadOnlyDSVs + lVar14) + 8))();
        }
        uVar7 = *(uint *)(lVar8 + 0x18);
      }
      uVar13 = uVar13 + 1;
      lVar14 = lVar14 + 8;
      lVar15 = lVar15 + 9;
    } while (uVar13 < uVar7);
  }
  return;
}

Assistant:

FramebufferBase(IReferenceCounters*    pRefCounters,
                    RenderDeviceImplType*  pDevice,
                    const FramebufferDesc& Desc,
                    bool                   bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal}
    {
        ValidateFramebufferDesc(this->m_Desc, this->GetDevice());

        if (this->m_Desc.Width == 0 || this->m_Desc.Height == 0 || this->m_Desc.NumArraySlices == 0)
        {
            for (Uint32 i = 0; i < this->m_Desc.AttachmentCount; ++i)
            {
                auto* const pAttachment = Desc.ppAttachments[i];
                if (pAttachment == nullptr)
                    continue;

                const auto& ViewDesc = pAttachment->GetDesc();
                if (ViewDesc.ViewType == TEXTURE_VIEW_SHADING_RATE)
                {
                    // Dimensions of the shading rate texture are less than the dimensions of other attachments
                    // and can't be used to compute the frame buffer size.
                    continue;
                }

                const auto& TexDesc       = pAttachment->GetTexture()->GetDesc();
                const auto  MipLevelProps = GetMipLevelProperties(TexDesc, ViewDesc.MostDetailedMip);
                if (this->m_Desc.Width == 0)
                    this->m_Desc.Width = MipLevelProps.LogicalWidth;
                if (this->m_Desc.Height == 0)
                    this->m_Desc.Height = MipLevelProps.LogicalHeight;
                if (this->m_Desc.NumArraySlices == 0)
                    this->m_Desc.NumArraySlices = ViewDesc.NumArraySlices;
            }
        }

        // It is legal for a subpass to use no color or depth/stencil attachments, either because it has no attachment
        // references or because all of them are VK_ATTACHMENT_UNUSED. This kind of subpass can use shader side effects
        // such as image stores and atomics to produce an output. In this case, the subpass continues to use the width,
        // height, and layers of the framebuffer to define the dimensions of the rendering area.
        if (this->m_Desc.Width == 0)
            LOG_ERROR_AND_THROW("The framebuffer width is zero and can't be automatically determined as there are no non-null attachments");
        if (this->m_Desc.Height == 0)
            LOG_ERROR_AND_THROW("The framebuffer height is zero and can't be automatically determined as there are no non-null attachments");
        if (this->m_Desc.NumArraySlices == 0)
            LOG_ERROR_AND_THROW("The framebuffer array slice count is zero and can't be automatically determined as there are no non-null attachments");

        if (this->m_Desc.AttachmentCount > 0)
        {
            m_ppAttachments =
                ALLOCATE(GetRawAllocator(), "Memory for framebuffer attachment array", ITextureView*, this->m_Desc.AttachmentCount);
            this->m_Desc.ppAttachments = m_ppAttachments;
            for (Uint32 i = 0; i < this->m_Desc.AttachmentCount; ++i)
            {
                if (Desc.ppAttachments[i] == nullptr)
                    continue;

                m_ppAttachments[i] = Desc.ppAttachments[i];
                m_ppAttachments[i]->AddRef();
            }
        }

        Desc.pRenderPass->AddRef();

        // Create read-only depth views for read-write depth attachments, if needed
        const RenderPassDesc& RPDesc = this->m_Desc.pRenderPass->GetDesc();
        for (Uint32 subpass = 0; subpass < RPDesc.SubpassCount; ++subpass)
        {
            const auto& SubpassDesc = RPDesc.pSubpasses[subpass];
            if (SubpassDesc.pDepthStencilAttachment == nullptr)
                continue;
            if (SubpassDesc.pDepthStencilAttachment->AttachmentIndex == ATTACHMENT_UNUSED)
                continue;
            if (SubpassDesc.pDepthStencilAttachment->State != RESOURCE_STATE_DEPTH_READ)
                continue;

            if (m_ppReadOnlyDSVs == nullptr)
            {
                m_ppReadOnlyDSVs =
                    ALLOCATE(GetRawAllocator(), "Memory for read-only depth attachment array", ITextureView*, RPDesc.SubpassCount);
                memset(m_ppReadOnlyDSVs, 0, sizeof(m_ppReadOnlyDSVs[0]) * RPDesc.SubpassCount);
            }

            auto* pDepthAttachment = m_ppAttachments[SubpassDesc.pDepthStencilAttachment->AttachmentIndex];
            VERIFY_EXPR(pDepthAttachment != nullptr);

            auto DSVDesc = pDepthAttachment->GetDesc();
            if (DSVDesc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
            {
                m_ppReadOnlyDSVs[subpass] = pDepthAttachment;
                m_ppReadOnlyDSVs[subpass]->AddRef();
            }
            else
            {
                // Create read-only depth view for this attachment
                VERIFY_EXPR(DSVDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
                DSVDesc.ViewType     = TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL;
                std::string ViewName = std::string{DSVDesc.Name} + " (read-only)";
                DSVDesc.Name         = ViewName.c_str();
                pDepthAttachment->GetTexture()->CreateView(DSVDesc, &m_ppReadOnlyDSVs[subpass]);
                VERIFY_EXPR(m_ppReadOnlyDSVs[subpass] != nullptr);
            }
        }
    }